

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O2

void __thiscall
iu_FileSystemTest_x_iutest_x_FileSize64bit_Test::Body
          (iu_FileSystemTest_x_iutest_x_FileSize64bit_Test *this)

{
  ParamType *pPVar1;
  iuCodeMessage *this_00;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_208;
  uintmax_t expectedSize;
  StdioFile file;
  undefined1 local_1b8 [424];
  
  pPVar1 = iutest::WithParamInterface<unsigned_long>::GetParam();
  expectedSize = *pPVar1;
  local_1b8._32_8_ = std::filesystem::file_size(&largefile_abi_cxx11_);
  iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&iutest_ar,(internal *)"expectedSize","::std::filesystem::file_size(largefile)",
             (char *)&expectedSize,(unsigned_long *)(local_1b8 + 0x20),in_R9);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)(local_1b8 + 0x20),0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)(local_1b8 + 0x20));
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x67,iutest_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)(local_1b8 + 0x20));
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)(local_1b8 + 0x20));
    std::__cxx11::string::~string((string *)&iutest_ar);
    return;
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  file.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00180e48;
  file.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00180e98;
  file.m_fp = (FILE *)0x0;
  iutest_ar.m_result = iutest::IFile::Open(&file.super_IFile,&largefile_abi_cxx11_,1);
  iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  if (iutest_ar.m_result) {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1b8._32_8_ = iutest::internal::posix::FileSize(file.m_fp);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&iutest_ar,(internal *)"expectedSize","file.GetSize()",(char *)&expectedSize,
               (unsigned_long *)(local_1b8 + 0x20),in_R9);
    if (iutest_ar.m_result != false) goto LAB_0014d08a;
    memset((iu_global_format_stringstream *)(local_1b8 + 0x20),0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)(local_1b8 + 0x20));
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x6c,iutest_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)(local_1b8 + 0x20));
    this_00 = &local_208;
  }
  else {
    memset((iu_global_format_stringstream *)(local_1b8 + 0x20),0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)(local_1b8 + 0x20));
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&iutest_ar,
               (AssertionResult *)"file.Open(largefile, iutest::IFile::OpenRead)","false","true",
               (char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x6a,(char *)local_1b8._0_8_);
    local_208._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)(local_1b8 + 0x20));
    std::__cxx11::string::~string((string *)&local_208);
    this_00 = (iuCodeMessage *)local_1b8;
  }
  std::__cxx11::string::~string((string *)this_00);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)(local_1b8 + 0x20));
LAB_0014d08a:
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::StdioFile::~StdioFile(&file);
  return;
}

Assistant:

IUTEST_P(FileSystemTest, FileSize64bit)
{
    const uintmax_t expectedSize = GetParam();
    IUTEST_ASSUME_EQ(expectedSize, ::std::filesystem::file_size(largefile));

    ::iutest::StdioFile file;
    IUTEST_ASSERT_TRUE( file.Open(largefile, iutest::IFile::OpenRead) );
#if IUTEST_HAS_FILENO && IUTEST_HAS_FILE_STAT
    IUTEST_EXPECT_EQ(expectedSize, file.GetSize());
#else
    IUTEST_INFORM_EQ(expectedSize, file.GetSize());
#endif
}